

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

void __thiscall
draco::PointCloud::SetAttribute
          (PointCloud *this,int att_id,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  Type TVar1;
  size_type sVar2;
  pointer pPVar3;
  value_type_conflict1 *in_RDX;
  uint32_t in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
  *in_stack_ffffffffffffffc8;
  pointer *in_stack_ffffffffffffffd0;
  value_type_conflict1 *__new_size;
  undefined4 in_stack_fffffffffffffff0;
  
  __new_size = in_RDX;
  sVar2 = std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::size((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if ((int)sVar2 <= (int)in_ESI) {
    std::
    vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ::resize((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_type)__new_size);
  }
  pPVar3 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
           operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)0x19c972);
  TVar1 = GeometryAttribute::attribute_type(&pPVar3->super_GeometryAttribute);
  if (TVar1 < NAMED_ATTRIBUTES_COUNT) {
    in_stack_ffffffffffffffd0 =
         &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    pPVar3 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
             operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         *)0x19c997);
    GeometryAttribute::attribute_type(&pPVar3->super_GeometryAttribute);
    std::vector<int,_std::allocator<int>_>::push_back(in_RDI,in_RDX);
  }
  pPVar3 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
           operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)0x19c9c1);
  GeometryAttribute::set_unique_id(&pPVar3->super_GeometryAttribute,in_ESI);
  std::
  vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
  ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(long)(int)in_ESI);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::operator=
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void PointCloud::SetAttribute(int att_id, std::unique_ptr<PointAttribute> pa) {
  DRACO_DCHECK(att_id >= 0);
  if (static_cast<int>(attributes_.size()) <= att_id) {
    attributes_.resize(att_id + 1);
  }
  if (pa->attribute_type() < GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    named_attribute_index_[pa->attribute_type()].push_back(att_id);
  }
  pa->set_unique_id(att_id);
  attributes_[att_id] = std::move(pa);
}